

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xxhash.h
# Opt level: O0

XXH128_hash_t
XXH3_len_129to240_128b(xxh_u8 *input,size_t len,xxh_u8 *secret,size_t secretSize,XXH64_hash_t seed)

{
  XXH128_hash_t XVar1;
  XXH64_hash_t XVar2;
  XXH64_hash_t XVar3;
  ulong in_RSI;
  uint i;
  XXH128_hash_t acc;
  XXH128_hash_t h128;
  undefined1 in_stack_ffffffffffffff80 [16];
  XXH128_hash_t in_stack_ffffffffffffff90;
  XXH128_hash_t in_stack_ffffffffffffffa0;
  uint local_4c;
  
  for (local_4c = 0x20; local_4c < 0xa0; local_4c = local_4c + 0x20) {
    in_stack_ffffffffffffffa0 =
         XXH128_mix32B(in_stack_ffffffffffffffa0,(xxh_u8 *)in_stack_ffffffffffffff90.high64,
                       (xxh_u8 *)in_stack_ffffffffffffff90.low64,in_stack_ffffffffffffff80._8_8_,
                       in_stack_ffffffffffffff80._0_8_);
  }
  XXH3_avalanche(0x10b68f);
  XXH3_avalanche(0x10b69e);
  local_4c = 0xa0;
  while( true ) {
    if (in_RSI < local_4c) break;
    in_stack_ffffffffffffff90 =
         XXH128_mix32B(in_stack_ffffffffffffffa0,(xxh_u8 *)in_stack_ffffffffffffff90.high64,
                       (xxh_u8 *)in_stack_ffffffffffffff90.low64,in_stack_ffffffffffffff80._8_8_,
                       in_stack_ffffffffffffff80._0_8_);
    local_4c = local_4c + 0x20;
  }
  XXH128_mix32B(in_stack_ffffffffffffffa0,(xxh_u8 *)in_stack_ffffffffffffff90.high64,
                (xxh_u8 *)in_stack_ffffffffffffff90.low64,in_stack_ffffffffffffff80._8_8_,
                in_stack_ffffffffffffff80._0_8_);
  XVar2 = XXH3_avalanche(0x10b7e2);
  XVar3 = XXH3_avalanche(0x10b7f4);
  XVar1.high64 = -XVar3;
  XVar1.low64 = XVar2;
  return XVar1;
}

Assistant:

XXH_NO_INLINE XXH_PUREF XXH128_hash_t
XXH3_len_129to240_128b(const xxh_u8* XXH_RESTRICT input, size_t len,
                       const xxh_u8* XXH_RESTRICT secret, size_t secretSize,
                       XXH64_hash_t seed)
{
    XXH_ASSERT(secretSize >= XXH3_SECRET_SIZE_MIN); (void)secretSize;
    XXH_ASSERT(128 < len && len <= XXH3_MIDSIZE_MAX);

    {   XXH128_hash_t acc;
        unsigned i;
        acc.low64 = len * XXH_PRIME64_1;
        acc.high64 = 0;
        /*
         *  We set as `i` as offset + 32. We do this so that unchanged
         * `len` can be used as upper bound. This reaches a sweet spot
         * where both x86 and aarch64 get simple agen and good codegen
         * for the loop.
         */
        for (i = 32; i < 160; i += 32) {
            acc = XXH128_mix32B(acc,
                                input  + i - 32,
                                input  + i - 16,
                                secret + i - 32,
                                seed);
        }
        acc.low64 = XXH3_avalanche(acc.low64);
        acc.high64 = XXH3_avalanche(acc.high64);
        /*
         * NB: `i <= len` will duplicate the last 32-bytes if
         * len % 32 was zero. This is an unfortunate necessity to keep
         * the hash result stable.
         */
        for (i=160; i <= len; i += 32) {
            acc = XXH128_mix32B(acc,
                                input + i - 32,
                                input + i - 16,
                                secret + XXH3_MIDSIZE_STARTOFFSET + i - 160,
                                seed);
        }
        /* last bytes */
        acc = XXH128_mix32B(acc,
                            input + len - 16,
                            input + len - 32,
                            secret + XXH3_SECRET_SIZE_MIN - XXH3_MIDSIZE_LASTOFFSET - 16,
                            (XXH64_hash_t)0 - seed);

        {   XXH128_hash_t h128;
            h128.low64  = acc.low64 + acc.high64;
            h128.high64 = (acc.low64    * XXH_PRIME64_1)
                        + (acc.high64   * XXH_PRIME64_4)
                        + ((len - seed) * XXH_PRIME64_2);
            h128.low64  = XXH3_avalanche(h128.low64);
            h128.high64 = (XXH64_hash_t)0 - XXH3_avalanche(h128.high64);
            return h128;
        }
    }
}